

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-non-blocking.c
# Opt level: O1

int run_test_pipe_set_non_blocking(void)

{
  int iVar1;
  int extraout_EAX;
  uv_barrier_t *barrier;
  int *piVar2;
  int *piVar3;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  uv_barrier_t *unaff_R14;
  ulong unaff_R15;
  int fd [2];
  uv_thread_t thread;
  thread_ctx ctx;
  uv_buf_t buf;
  uv_pipe_t pipe_handle;
  char data [4096];
  undefined1 auStack_2180 [4096];
  uv_loop_t *puStack_1180;
  uv_barrier_t *puStack_1178;
  code *pcStack_1170;
  uv_file local_1168;
  uint local_1164;
  undefined1 local_1160 [40];
  uint local_1138;
  undefined1 local_1130 [16];
  uv_pipe_t local_1120;
  undefined1 local_1018 [4096];
  
  pcStack_1170 = (code *)0x163ddd;
  barrier = (uv_barrier_t *)uv_default_loop();
  pcStack_1170 = (code *)0x163dec;
  iVar1 = uv_pipe_init((uv_loop_t *)barrier,&local_1120,0);
  if (iVar1 == 0) {
    barrier = (uv_barrier_t *)0x1;
    pcStack_1170 = (code *)0x163e08;
    iVar1 = socketpair(1,1,0,&local_1168);
    if (iVar1 != 0) goto LAB_00163f79;
    barrier = (uv_barrier_t *)&local_1120;
    pcStack_1170 = (code *)0x163e1d;
    iVar1 = uv_pipe_open((uv_pipe_t *)barrier,local_1168);
    if (iVar1 != 0) goto LAB_00163f7e;
    barrier = (uv_barrier_t *)&local_1120;
    pcStack_1170 = (code *)0x163e34;
    iVar1 = uv_stream_set_blocking((uv_stream_t *)barrier,1);
    if (iVar1 != 0) goto LAB_00163f83;
    barrier = (uv_barrier_t *)(local_1160 + 8);
    local_1138 = local_1164;
    pcStack_1170 = (code *)0x163e52;
    iVar1 = uv_barrier_init(barrier,2);
    if (iVar1 != 0) goto LAB_00163f88;
    barrier = (uv_barrier_t *)local_1160;
    pcStack_1170 = (code *)0x163e70;
    iVar1 = uv_thread_create((uv_thread_t *)&barrier->__align,thread_main,local_1160 + 8);
    if (iVar1 != 0) goto LAB_00163f8d;
    pcStack_1170 = (code *)0x163e82;
    uv_barrier_wait((uv_barrier_t *)(local_1160 + 8));
    unaff_RBX = (uv_loop_t *)local_1130;
    local_1130._8_8_ = 0x1000;
    local_1130._0_8_ = local_1018;
    pcStack_1170 = (code *)0x163ea9;
    memset((void *)local_1130._0_8_,0x2e,0x1000);
    unaff_R15 = 0xfffffffffffff000;
    unaff_R14 = (uv_barrier_t *)&local_1120;
    do {
      pcStack_1170 = (code *)0x163ec5;
      barrier = unaff_R14;
      iVar1 = uv_try_write((uv_stream_t *)unaff_R14,(uv_buf_t *)unaff_RBX,1);
      if (iVar1 != 0x1000) {
        pcStack_1170 = (code *)0x163f74;
        run_test_pipe_set_non_blocking_cold_7();
        goto LAB_00163f74;
      }
      unaff_R15 = unaff_R15 + 0x1000;
    } while (unaff_R15 < 0x9ff000);
    pcStack_1170 = (code *)0x163eec;
    uv_close((uv_handle_t *)&local_1120,(uv_close_cb)0x0);
    pcStack_1170 = (code *)0x163ef1;
    barrier = (uv_barrier_t *)uv_default_loop();
    pcStack_1170 = (code *)0x163efb;
    iVar1 = uv_run((uv_loop_t *)barrier,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00163f92;
    barrier = (uv_barrier_t *)local_1160;
    pcStack_1170 = (code *)0x163f0d;
    iVar1 = uv_thread_join((uv_thread_t *)&barrier->__align);
    if (iVar1 != 0) goto LAB_00163f97;
    barrier = (uv_barrier_t *)(ulong)local_1164;
    pcStack_1170 = (code *)0x163f1e;
    iVar1 = close(local_1164);
    if (iVar1 == 0) {
      pcStack_1170 = (code *)0x163f2c;
      uv_barrier_destroy((uv_barrier_t *)(local_1160 + 8));
      pcStack_1170 = (code *)0x163f31;
      unaff_RBX = uv_default_loop();
      pcStack_1170 = (code *)0x163f45;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      pcStack_1170 = (code *)0x163f4f;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      pcStack_1170 = (code *)0x163f54;
      barrier = (uv_barrier_t *)uv_default_loop();
      pcStack_1170 = (code *)0x163f5c;
      iVar1 = uv_loop_close((uv_loop_t *)barrier);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163fa1;
    }
  }
  else {
LAB_00163f74:
    pcStack_1170 = (code *)0x163f79;
    run_test_pipe_set_non_blocking_cold_1();
LAB_00163f79:
    pcStack_1170 = (code *)0x163f7e;
    run_test_pipe_set_non_blocking_cold_2();
LAB_00163f7e:
    pcStack_1170 = (code *)0x163f83;
    run_test_pipe_set_non_blocking_cold_3();
LAB_00163f83:
    pcStack_1170 = (code *)0x163f88;
    run_test_pipe_set_non_blocking_cold_4();
LAB_00163f88:
    pcStack_1170 = (code *)0x163f8d;
    run_test_pipe_set_non_blocking_cold_5();
LAB_00163f8d:
    pcStack_1170 = (code *)0x163f92;
    run_test_pipe_set_non_blocking_cold_6();
LAB_00163f92:
    pcStack_1170 = (code *)0x163f97;
    run_test_pipe_set_non_blocking_cold_8();
LAB_00163f97:
    pcStack_1170 = (code *)0x163f9c;
    run_test_pipe_set_non_blocking_cold_9();
  }
  pcStack_1170 = (code *)0x163fa1;
  run_test_pipe_set_non_blocking_cold_10();
LAB_00163fa1:
  pcStack_1170 = thread_main;
  run_test_pipe_set_non_blocking_cold_11();
  puStack_1180 = unaff_RBX;
  puStack_1178 = unaff_R14;
  pcStack_1170 = (code *)unaff_R15;
  uv_barrier_wait(barrier);
  do {
    do {
      handle = (uv_handle_t *)(ulong)*(uint *)(barrier + 1);
      piVar2 = (int *)read(*(uint *)(barrier + 1),auStack_2180,0x1000);
    } while (0 < (long)piVar2);
    piVar3 = piVar2;
    if (piVar2 != (int *)0xffffffffffffffff) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (piVar2 == (int *)0x0) {
    return (int)piVar3;
  }
  thread_main_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_set_non_blocking) {
  struct thread_ctx ctx;
  uv_pipe_t pipe_handle;
  uv_thread_t thread;
  size_t nwritten;
  char data[4096];
  uv_buf_t buf;
  int fd[2];
  int n;

  ASSERT(0 == uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, fd));
  ASSERT(0 == uv_pipe_open(&pipe_handle, fd[0]));
  ASSERT(0 == uv_stream_set_blocking((uv_stream_t*) &pipe_handle, 1));

  ctx.fd = fd[1];
  ASSERT(0 == uv_barrier_init(&ctx.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));
  uv_barrier_wait(&ctx.barrier);

  buf.len = sizeof(data);
  buf.base = data;
  memset(data, '.', sizeof(data));

  nwritten = 0;
  while (nwritten < 10 << 20) {
    /* The stream is in blocking mode so uv_try_write() should always succeed
     * with the exact number of bytes that we wanted written.
     */
    n = uv_try_write((uv_stream_t*) &pipe_handle, &buf, 1);
    ASSERT(n == sizeof(data));
    nwritten += n;
  }

  uv_close((uv_handle_t*) &pipe_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == close(fd[1]));  /* fd[0] is closed by uv_close(). */
  uv_barrier_destroy(&ctx.barrier);

  MAKE_VALGRIND_HAPPY();
  return 0;
}